

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json-validator.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_81391::schema_ref::schema_ref(schema_ref *this,string *id,root_schema *root)

{
  pointer pcVar1;
  
  (this->super_schema).root_ = root;
  (this->super_schema).default_value_.m_type = null;
  (this->super_schema).default_value_.m_value.object = (object_t *)0x0;
  (this->super_schema)._vptr_schema = (_func_int **)&PTR_make_for_default__00157068;
  (this->id_)._M_dataplus._M_p = (pointer)&(this->id_).field_2;
  pcVar1 = (id->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->id_,pcVar1,pcVar1 + id->_M_string_length);
  (this->target_strong_).
  super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->target_strong_).
  super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->target_).super___weak_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  (this->target_).super___weak_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  return;
}

Assistant:

schema_ref(const std::string &id, root_schema *root)
	    : schema(root), id_(id) {}